

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2-server.c
# Opt level: O2

ChanopenResult *
ssh2_connection_parse_channel_open
          (ChanopenResult *__return_storage_ptr__,ssh2_connection_state *s,ptrlen type,PktIn *pktin,
          SshChannel *sc)

{
  LogContext *pLVar1;
  _Bool _Var2;
  uint uVar3;
  char *pcVar4;
  unsigned_long uVar5;
  char *pcVar6;
  BinarySource *src;
  ptrlen pl;
  ptrlen pVar7;
  Channel *local_38;
  
  _Var2 = ptrlen_eq_string(type,"session");
  if (_Var2) {
    pLVar1 = (s->ppl).logctx;
    pcVar4 = dupprintf("Opened session channel");
    logevent_and_free(pLVar1,pcVar4);
    __return_storage_ptr__->outcome = CHANOPEN_RESULT_SUCCESS;
    local_38 = sesschan_new(sc,(s->ppl).logctx,s->sftpserver_vt,s->ssc);
  }
  else {
    _Var2 = ptrlen_eq_string(type,"direct-tcpip");
    if (_Var2) {
      src = pktin->binarysource_;
      pl = BinarySource_get_string(src);
      uVar5 = BinarySource_get_uint32(src);
      pVar7 = BinarySource_get_string(src);
      BinarySource_get_uint32(src);
      pcVar4 = mkstr(pl);
      pLVar1 = (s->ppl).logctx;
      uVar3 = string_length_for_printf(pVar7.len);
      pcVar6 = dupprintf("Received request to connect to port %s:%d (from %.*s:%d)",pcVar4,
                         uVar5 & 0xffffffff,(ulong)uVar3,pVar7.ptr);
      logevent_and_free(pLVar1,pcVar6);
      pcVar6 = portfwdmgr_connect(s->portfwdmgr,&local_38,pcVar4,(int)uVar5,sc,0);
      safefree(pcVar4);
      pLVar1 = (s->ppl).logctx;
      if (pcVar6 == (char *)0x0) {
        pcVar4 = dupprintf("Port opened successfully");
        logevent_and_free(pLVar1,pcVar4);
      }
      else {
        pcVar4 = dupprintf("Port open failed: %s",pcVar6);
        logevent_and_free(pLVar1,pcVar4);
        safefree(pcVar6);
        (__return_storage_ptr__->u).failure.reason_code = 2;
        local_38 = (Channel *)dupprintf("Connection failed");
      }
      __return_storage_ptr__->outcome = (uint)(pcVar6 == (char *)0x0);
    }
    else {
      __return_storage_ptr__->outcome = CHANOPEN_RESULT_FAILURE;
      (__return_storage_ptr__->u).failure.reason_code = 3;
      local_38 = (Channel *)dupprintf("Unsupported channel type requested");
    }
  }
  (__return_storage_ptr__->u).failure.wire_message = (char *)local_38;
  return __return_storage_ptr__;
}

Assistant:

ChanopenResult ssh2_connection_parse_channel_open(
    struct ssh2_connection_state *s, ptrlen type,
    PktIn *pktin, SshChannel *sc)
{
    if (ptrlen_eq_string(type, "session")) {
        return chan_open_session(s, sc);
    } else if (ptrlen_eq_string(type, "direct-tcpip")) {
        ptrlen dstaddr = get_string(pktin);
        int dstport = toint(get_uint32(pktin));
        ptrlen peeraddr = get_string(pktin);
        int peerport = toint(get_uint32(pktin));
        return chan_open_direct_tcpip(
            s, sc, dstaddr, dstport, peeraddr, peerport);
    } else {
        CHANOPEN_RETURN_FAILURE(
            SSH2_OPEN_UNKNOWN_CHANNEL_TYPE,
            ("Unsupported channel type requested"));
    }
}